

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

string_view bloaty::ReadUntilConsuming(string_view *data,char c)

{
  char *pcVar1;
  ulong __n;
  char *__s;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  undefined7 in_register_00000031;
  Arg *in_R8;
  string_view sVar5;
  string_view format;
  string local_70;
  char local_50 [8];
  char *local_48;
  char local_40 [32];
  
  __n = data->_M_len;
  __s = data->_M_str;
  pvVar2 = memchr(__s,(int)CONCAT71(in_register_00000031,c),__n);
  uVar3 = (long)pvVar2 - (long)__s;
  if (pvVar2 == (void *)0x0) {
    uVar3 = __n;
  }
  pcVar1 = __s + uVar3;
  data->_M_str = pcVar1;
  sVar4 = __n - uVar3;
  data->_M_len = sVar4;
  if ((sVar4 != 0) && (*pcVar1 == c)) {
    if (__n < uVar3) {
      uVar3 = __n;
    }
    data->_M_str = pcVar1 + 1;
    data->_M_len = sVar4 - 1;
    sVar5._M_str = __s;
    sVar5._M_len = uVar3;
    return sVar5;
  }
  if (c == '\0') {
    Throw("string is not NULL-terminated",0x20);
  }
  local_48 = local_40;
  local_50[0] = '\x01';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  format._M_str = local_50;
  format._M_len = (size_t)"could not find terminating character \'$0\'";
  local_40[0] = c;
  absl::Substitute_abi_cxx11_(&local_70,(absl *)0x29,format,in_R8);
  Throw(local_70._M_dataplus._M_p,0x22);
}

Assistant:

std::string_view ReadUntilConsuming(std::string_view* data, char c) {
  std::string_view ret = ReadUntil(data, c);

  if (data->empty() || data->front() != c) {
    // Nothing left, meaning we didn't find the terminating character.
    if (c == '\0') {
      THROW("string is not NULL-terminated");
    }
    THROWF("could not find terminating character '$0'", c);
  }

  data->remove_prefix(1);  // Remove the terminating character also.
  return ret;
}